

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_files.cpp
# Opt level: O0

int create_files(int argc,char **argv)

{
  long lVar1;
  request *prVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *pCVar5;
  bool bVar6;
  size_type sVar7;
  char *__name;
  Logger *pLVar8;
  reference pvVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  syscall_file *this;
  unsigned_long *puVar13;
  ostream *poVar14;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *pCVar15;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *this_00;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  ulong local_798;
  request *local_788;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  Logger local_6d8;
  LoggerVoidify local_55d;
  int local_55c;
  Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_> local_558;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> local_530;
  double local_528;
  double end;
  double begin;
  ulong local_510;
  size_t current_chunk_size;
  ulong local_500;
  size_t current_block_size;
  stringstream ss;
  ostream local_4e8 [376];
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *local_370;
  request_ptr *reqs;
  file **disks;
  int *buffer;
  size_t j;
  size_t i;
  size_t chunk_size_int;
  size_t chunk_size;
  long lStack_330;
  uint chunks;
  size_t buffer_size_int;
  size_t buffer_size;
  size_t ndisks;
  LoggerVoidify local_199;
  ulong local_198;
  size_t i_1;
  external_size_type endpos;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  undefined1 local_d8 [8];
  CmdlineParser cp;
  external_size_type length;
  external_size_type offset;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  disks_arr;
  char **argv_local;
  int argc_local;
  
  disks_arr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&offset);
  length = 0;
  tlx::CmdlineParser::CmdlineParser((CmdlineParser *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"filesize",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"Number of bytes to write to files.",&local_131)
  ;
  tlx::CmdlineParser::add_param_bytes
            ((CmdlineParser *)local_d8,&local_108,(uint64_t *)&cp.line_wrap_,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"filename",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_180,"Paths to files to write.",(allocator *)((long)&endpos + 7));
  tlx::CmdlineParser::add_param_stringlist
            ((CmdlineParser *)local_d8,&local_158,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&offset,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&endpos + 7));
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  bVar6 = tlx::CmdlineParser::process
                    ((CmdlineParser *)local_d8,argc,
                     (char **)disks_arr.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar6) {
    i_1 = cp._144_8_;
    for (local_198 = 0; uVar10 = local_198,
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&offset), uVar10 < sVar7; local_198 = local_198 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&offset,local_198);
      __name = (char *)std::__cxx11::string::c_str();
      unlink(__name);
      tlx::Logger::Logger((Logger *)&ndisks);
      pLVar8 = tlx::Logger::operator<<((Logger *)&ndisks,(char (*) [13])"# Add disk: ");
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&offset,local_198);
      pLVar8 = tlx::Logger::operator<<(pLVar8,pvVar9);
      tlx::LoggerVoidify::operator&(&local_199,pLVar8);
      tlx::Logger::~Logger((Logger *)&ndisks);
    }
    buffer_size = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&offset);
    buffer_size_int = 0x10000000;
    lStack_330 = 0x4000000;
    chunk_size._4_4_ = 2;
    chunk_size_int = 0x8000000;
    i = 0x2000000;
    j = 0;
    buffer = (int *)0x0;
    disks = (file **)foxxll::aligned_alloc<4096ul>(buffer_size * 0x10000000,0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = buffer_size;
    uVar10 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    reqs = (request_ptr *)operator_new__(uVar10);
    uVar10 = buffer_size * chunk_size._4_4_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar10;
    uVar11 = SUB168(auVar4 * ZEXT816(8),0);
    uVar17 = uVar11 + 8;
    if (0xfffffffffffffff7 < uVar11) {
      uVar17 = 0xffffffffffffffff;
    }
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    puVar12 = (ulong *)operator_new__(uVar17);
    *puVar12 = uVar10;
    local_370 = (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)(puVar12 + 1);
    if (uVar10 != 0) {
      local_768 = local_370;
      do {
        tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::CountingPtr(local_768);
        local_768 = local_768 + 1;
      } while (local_768 != local_370 + uVar10);
    }
    for (j = 0; j < buffer_size * lStack_330; j = j + 1) {
      *(int *)((long)disks + j * 4) = (int)j;
    }
    for (j = 0; j < buffer_size; j = j + 1) {
      this = (syscall_file *)operator_new(0x98);
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&offset,j);
      foxxll::syscall_file::syscall_file(this,pvVar9,0x1c,(int)j,-1,0xffffffff,(file_stats *)0x0);
      local_788 = (request *)0x0;
      if (this != (syscall_file *)0x0) {
        local_788 = (request *)&(this->super_ufs_file_base).field_0x70;
      }
      reqs[j].ptr_ = local_788;
    }
    while (pCVar5 = local_370, length < i_1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&current_block_size);
      if (cp._144_8_ == 0) {
        local_798 = buffer_size_int;
      }
      else {
        current_chunk_size = i_1 - length;
        puVar13 = std::min<unsigned_long>(&buffer_size_int,&current_chunk_size);
        local_798 = *puVar13;
      }
      local_500 = local_798;
      local_510 = local_798 / chunk_size._4_4_;
      poVar14 = std::operator<<(local_4e8,"Disk offset ");
      begin._4_4_ = std::setw(7);
      poVar14 = std::operator<<(poVar14,begin._4_4_);
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,length >> 0x14);
      poVar14 = std::operator<<(poVar14," MiB: ");
      std::ostream::operator<<(poVar14,std::fixed);
      end = foxxll::timestamp();
      for (j = 0; j < buffer_size; j = j + 1) {
        for (buffer = (int *)0x0; uVar10 = local_510, buffer < (int *)(ulong)chunk_size._4_4_;
            buffer = (int *)((long)buffer + 1)) {
          prVar2 = reqs[j].ptr_;
          lVar1 = (long)disks + (long)buffer * i * 4 + lStack_330 * j * 4;
          lVar16 = (long)buffer * local_510;
          local_558.store_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_558.store_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_558.caller_ = (Caller)0x0;
          local_558.object_ptr_ = (void *)0x0;
          tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::Delegate(&local_558)
          ;
          (**(code **)(*(long *)prVar2 + 8))
                    (&local_530,prVar2,lVar1,length + lVar16,uVar10,&local_558);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator=
                    (local_370 + (long)(j * chunk_size._4_4_ + (long)buffer),&local_530);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr
                    (&local_530);
          tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::~Delegate
                    (&local_558);
        }
      }
      foxxll::wait_all(local_370,buffer_size * chunk_size._4_4_);
      local_528 = foxxll::timestamp();
      local_55c = (int)std::setw(7);
      poVar14 = std::operator<<(local_4e8,(_Setw)local_55c);
      auVar18._8_4_ = (int)(local_500 >> 0x20);
      auVar18._0_8_ = local_500;
      auVar18._12_4_ = 0x45300000;
      poVar14 = (ostream *)
                std::ostream::operator<<
                          (poVar14,(int)((((auVar18._8_8_ - 1.9342813113834067e+25) +
                                          ((double)CONCAT44(0x43300000,(int)local_500) -
                                          4503599627370496.0)) * 9.5367431640625e-07) /
                                        (local_528 - end)));
      std::operator<<(poVar14," MiB/s,");
      tlx::Logger::Logger(&local_6d8);
      std::__cxx11::stringstream::str();
      pLVar8 = tlx::Logger::operator<<(&local_6d8,&local_6f8);
      tlx::LoggerVoidify::operator&(&local_55d,pLVar8);
      std::__cxx11::string::~string((string *)&local_6f8);
      tlx::Logger::~Logger(&local_6d8);
      length = local_500 + length;
      std::__cxx11::stringstream::~stringstream((stringstream *)&current_block_size);
    }
    if (local_370 != (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)0x0) {
      pCVar15 = local_370 + -1;
      prVar2 = local_370[-1].ptr_;
      this_00 = local_370 + (long)prVar2;
      while (pCVar5 != this_00) {
        this_00 = this_00 + -1;
        tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr(this_00);
      }
      operator_delete__(pCVar15,(long)prVar2 * 8 + 8);
    }
    for (j = 0; j < buffer_size; j = j + 1) {
      if (reqs[j].ptr_ != (request *)0x0) {
        (**(code **)(*(long *)reqs[j].ptr_ + 0x60))();
      }
    }
    if (reqs != (request_ptr *)0x0) {
      operator_delete__(reqs);
    }
    foxxll::aligned_dealloc<4096ul>(disks);
    argv_local._4_4_ = 0;
  }
  else {
    argv_local._4_4_ = -1;
  }
  endpos._0_4_ = 1;
  tlx::CmdlineParser::~CmdlineParser((CmdlineParser *)local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&offset);
  return argv_local._4_4_;
}

Assistant:

int create_files(int argc, char* argv[])
{
    std::vector<std::string> disks_arr;
    external_size_type offset = 0, length;

    tlx::CmdlineParser cp;
    cp.add_param_bytes(
        "filesize", length,
        "Number of bytes to write to files."
    );
    cp.add_param_stringlist(
        "filename", disks_arr,
        "Paths to files to write."
    );

    if (!cp.process(argc, argv))
        return -1;

    external_size_type endpos = offset + length;

    for (size_t i = 0; i < disks_arr.size(); ++i)
    {
        unlink(disks_arr[i].c_str());
        LOG1 << "# Add disk: " << disks_arr[i];
    }

    const size_t ndisks = disks_arr.size();

#if FOXXLL_WINDOWS
    size_t buffer_size = 64 * MB;
#else
    size_t buffer_size = 256 * MB;
#endif
    const size_t buffer_size_int = buffer_size / sizeof(int);

    unsigned chunks = 2;
    const size_t chunk_size = buffer_size / chunks;
    const size_t chunk_size_int = chunk_size / sizeof(int);

    size_t i = 0, j = 0;

    auto* buffer = static_cast<int*>(foxxll::aligned_alloc<BLOCK_ALIGN>(buffer_size * ndisks));
    file** disks = new file*[ndisks];
    request_ptr* reqs = new request_ptr[ndisks * chunks];
#ifdef WATCH_TIMES
    double* r_finish_times = new double[ndisks];
    double* w_finish_times = new double[ndisks];
#endif

    for (i = 0; i < ndisks * buffer_size_int; i++)
        buffer[i] = static_cast<int>(i);

    for (i = 0; i < ndisks; i++)
    {
#if FOXXLL_WINDOWS
 #ifdef RAW_ACCESS
        disks[i] = new foxxll::wincall_file(
                disks_arr[i],
                file::CREAT | file::RDWR | file::DIRECT, static_cast<int>(i)
            );
 #else
        disks[i] = new foxxll::wincall_file(
                disks_arr[i],
                file::CREAT | file::RDWR, static_cast<int>(i)
            );
 #endif
#else
 #ifdef RAW_ACCESS
        disks[i] = new foxxll::syscall_file(
                disks_arr[i],
                file::CREAT | file::RDWR | file::DIRECT, static_cast<int>(i)
            );
 #else
        disks[i] = new foxxll::syscall_file(
                disks_arr[i],
                file::CREAT | file::RDWR, static_cast<int>(i)
            );
 #endif
#endif
    }

    while (offset < endpos)
    {
        std::stringstream ss;

        const size_t current_block_size =
            length
            ? static_cast<size_t>(std::min<external_size_type>(buffer_size, endpos - offset))
            : buffer_size;

        const size_t current_chunk_size = current_block_size / chunks;

        ss << "Disk offset " << std::setw(7) << offset / MB << " MiB: " << std::fixed;

        double begin = timestamp(), end;

#ifndef DO_ONLY_READ
        for (i = 0; i < ndisks; i++)
        {
            for (j = 0; j < chunks; j++)
                reqs[i * chunks + j] =
                    disks[i]->awrite(
                        buffer + buffer_size_int * i + j * chunk_size_int,
                        offset + j * current_chunk_size,
                        current_chunk_size
                    );
        }

 #ifdef WATCH_TIMES
        watch_times(reqs, ndisks, w_finish_times);
 #else
        wait_all(reqs, ndisks * chunks);
 #endif

        end = timestamp();

 #ifdef WATCH_TIMES
        out_stat(begin, end, w_finish_times, ndisks, disks_arr);
 #endif
        ss << std::setw(7) << int(double(current_block_size) / MB / (end - begin)) << " MiB/s,";
#endif

#ifndef NOREAD
        begin = timestamp();

        for (i = 0; i < ndisks; i++)
        {
            for (j = 0; j < chunks; j++)
                reqs[i * chunks + j] = disks[i]->aread(
                        buffer + buffer_size_int * i + j * chunk_size_int,
                        offset + j * current_chunk_size,
                        current_chunk_size
                    );
        }

 #ifdef WATCH_TIMES
        watch_times(reqs, ndisks, r_finish_times);
 #else
        wait_all(reqs, ndisks * chunks);
 #endif

        end = timestamp();

        ss << int(double(current_block_size) / MB / (end - begin)) << " MiB/s";
        ss.str();

#ifdef WATCH_TIMES
        out_stat(begin, end, r_finish_times, ndisks, disks_arr);
#endif

        if (CHECK_AFTER_READ) {
            for (size_t i = 0; i < ndisks * buffer_size_int; i++)
            {
                if (buffer[i] != static_cast<int>(i))
                {
                    size_t ibuf = i / buffer_size_int;
                    size_t pos = i % buffer_size_int;

                    LOG1 << "Error on disk " << ibuf << " position " << std::hex << std::setw(8) << offset + pos * sizeof(int)
                         << "  got: " << std::hex << std::setw(8) << buffer[i] << " wanted: " << std::hex << std::setw(8) << static_cast<int>(i)
                         << std::dec;

                    i = (ibuf + 1) * buffer_size_int; // jump to next
                }
            }
        }
#else
        LOG1 << ss.str();
#endif

        offset += current_block_size;
    }

#ifdef WATCH_TIMES
    delete[] r_finish_times;
    delete[] w_finish_times;
#endif
    delete[] reqs;
    for (i = 0; i < ndisks; i++)
        delete disks[i];
    delete[] disks;
    foxxll::aligned_dealloc<BLOCK_ALIGN>(buffer);

    return 0;
}